

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# accum.c
# Opt level: O0

int32 accum_gauden(float32 ***denacc,uint32 *lcl2gbl,uint32 n_lcl2gbl,vector_t *frame,
                  uint32 ***den_idx,gauden_t *g,int32 mean_reest,int32 var_reest,int32 pass2var,
                  float32 ***wacc,int32 var_is_full,FILE *pdumpfh,feat_t *fcb)

{
  float x;
  uint uVar1;
  uint uVar2;
  vector_t ***ppppfVar3;
  vector_t ***ppppfVar4;
  vector_t ***ppppfVar5;
  vector_t ****pppppfVar6;
  float32 ***pppfVar7;
  float32 *x_00;
  uint32 *puVar8;
  float32 *pfVar9;
  vector_t pfVar10;
  float fVar11;
  float32 *denacc_row;
  uint32 *den_idx_row;
  vector_t feat;
  int n_density;
  int n_top;
  float32 obs_cnt;
  float32 diff;
  float32 ***dnom;
  vector_t dvec;
  vector_t *cov;
  vector_t *fv;
  vector_t ****fullvacc;
  vector_t v;
  vector_t ***vacc;
  vector_t pm;
  vector_t ***mean;
  vector_t m;
  vector_t ***macc;
  uint32 l;
  uint32 kk;
  uint32 k;
  uint32 j;
  uint32 i;
  uint32 g_i;
  gauden_t *g_local;
  uint32 ***den_idx_local;
  vector_t *frame_local;
  uint32 n_lcl2gbl_local;
  uint32 *lcl2gbl_local;
  float32 ***denacc_local;
  
  ppppfVar3 = g->l_macc;
  ppppfVar4 = g->mean;
  vacc = (vector_t ***)0x0;
  ppppfVar5 = g->l_vacc;
  fullvacc = (vector_t ****)0x0;
  pppppfVar6 = g->l_fullvacc;
  cov = (vector_t *)0x0;
  dvec = (vector_t)0x0;
  dnom = (float32 ***)0x0;
  pppfVar7 = g->l_dnom;
  uVar1 = g->n_top;
  uVar2 = g->n_density;
  for (k = 0; k < n_lcl2gbl; k = k + 1) {
    for (kk = 0; kk < g->n_feat; kk = kk + 1) {
      x_00 = (float32 *)frame[kk];
      puVar8 = den_idx[k][kk];
      pfVar9 = denacc[k][kk];
      if (var_is_full != 0) {
        ckd_free_2d(dvec);
        dvec = (vector_t)
               __ckd_calloc_2d__((ulong)g->veclen[kk],(ulong)g->veclen[kk],4,
                                 "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/accum.c"
                                 ,0xe3);
        ckd_free(dnom);
        dnom = (float32 ***)
               __ckd_calloc__((ulong)g->veclen[kk],4,
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/accum.c"
                              ,0xe5);
      }
      for (macc._4_4_ = 0; macc._4_4_ < uVar1; macc._4_4_ = macc._4_4_ + 1) {
        if (uVar1 == uVar2) {
          l = macc._4_4_;
        }
        else {
          l = puVar8[macc._4_4_];
        }
        x = (float)pfVar9[l];
        if (1.2e-38 < x) {
          if (pdumpfh != (FILE *)0x0) {
            fprintf((FILE *)pdumpfh,"%u %u %u %g\n",(double)x,(ulong)lcl2gbl[k],(ulong)kk,(ulong)l);
          }
          pfVar10 = ppppfVar3[k][kk][l];
          if (pass2var != 0) {
            vacc = (vector_t ***)ppppfVar4[lcl2gbl[k]][kk][l];
          }
          if (var_reest != 0) {
            if (var_is_full == 0) {
              fullvacc = (vector_t ****)ppppfVar5[k][kk][l];
            }
            else {
              cov = pppppfVar6[k][kk][l];
            }
          }
          if ((var_reest != 0) && (var_is_full != 0)) {
            if (pass2var == 0) {
              outerproduct((float32 **)dvec,x_00,x_00,g->veclen[kk]);
            }
            else {
              for (macc._0_4_ = 0; (uint)macc < g->veclen[kk]; macc._0_4_ = (uint)macc + 1) {
                *(float *)((long)dnom + (ulong)(uint)macc * 4) =
                     (float)x_00[(uint)macc] - *(float *)((long)vacc + (ulong)(uint)macc * 4);
              }
              outerproduct((float32 **)dvec,(float32 *)dnom,(float32 *)dnom,g->veclen[kk]);
            }
            scalarmultiply((float32 **)dvec,(float32)x,g->veclen[kk]);
            matrixadd((float32 **)cov,(float32 **)dvec,g->veclen[kk]);
          }
          if (mean_reest != 0) {
            for (macc._0_4_ = 0; (uint)macc < g->veclen[kk]; macc._0_4_ = (uint)macc + 1) {
              pfVar10[(uint)macc] = x * (float)x_00[(uint)macc] + pfVar10[(uint)macc];
            }
          }
          if ((var_reest != 0) && (var_is_full == 0)) {
            if (pass2var == 0) {
              for (macc._0_4_ = 0; (uint)macc < g->veclen[kk]; macc._0_4_ = (uint)macc + 1) {
                *(float *)((long)fullvacc + (ulong)(uint)macc * 4) =
                     x * (float)x_00[(uint)macc] * (float)x_00[(uint)macc] +
                     *(float *)((long)fullvacc + (ulong)(uint)macc * 4);
              }
            }
            else {
              for (macc._0_4_ = 0; (uint)macc < g->veclen[kk]; macc._0_4_ = (uint)macc + 1) {
                fVar11 = (float)x_00[(uint)macc] - *(float *)((long)vacc + (ulong)(uint)macc * 4);
                *(float *)((long)fullvacc + (ulong)(uint)macc * 4) =
                     x * fVar11 * fVar11 + *(float *)((long)fullvacc + (ulong)(uint)macc * 4);
              }
            }
          }
          pppfVar7[k][kk][l] = (float32)(x + (float)pppfVar7[k][kk][l]);
        }
      }
      if (var_is_full != 0) {
        ckd_free_2d(dvec);
        dvec = (vector_t)0x0;
        ckd_free(dnom);
        dnom = (float32 ***)0x0;
      }
    }
  }
  if (pdumpfh != (FILE *)0x0) {
    fputs("\n",(FILE *)pdumpfh);
  }
  return 0;
}

Assistant:

int
accum_gauden(float32 ***denacc,
	     uint32 *lcl2gbl,
	     uint32 n_lcl2gbl,
	     vector_t *frame,
	     uint32 ***den_idx,
	     gauden_t *g,
	     int32 mean_reest,
	     int32 var_reest,
	     int32 pass2var,
	     float32 ***wacc,
	     int32 var_is_full,
	     FILE *pdumpfh,
	     feat_t* fcb)
{
    uint32 g_i, i, j, k, kk, l;

    vector_t ***macc = g->l_macc;	/* local to utt */
    vector_t m;
    vector_t ***mean = g->mean;
    vector_t pm = NULL;

    vector_t ***vacc = g->l_vacc;
    vector_t v = NULL;

    vector_t ****fullvacc = g->l_fullvacc;
    vector_t *fv = NULL;
    vector_t *cov = NULL;
    vector_t dvec = NULL;

    float32 ***dnom = g->l_dnom;

    float32 diff;
    float32 obs_cnt;
    
    int n_top = gauden_n_top(g);
    int n_density = gauden_n_density(g);

    /* for each density family found in the utterance */
    for (i = 0; i < n_lcl2gbl; i++) {

	g_i = lcl2gbl[i];

	/* for each feature */
	for (j = 0; j < gauden_n_feat(g); j++) {
	    vector_t feat = frame[j];
	    uint32* den_idx_row = den_idx[i][j];
	    float32* denacc_row = denacc[i][j];

	    if (var_is_full) {
		ckd_free_2d((void **)cov);
		cov = (vector_t *)ckd_calloc_2d(g->veclen[j], g->veclen[j], sizeof(float32));
		ckd_free(dvec);
		dvec = ckd_calloc(g->veclen[j], sizeof(float32));
	    }
	    

	    /* for each density in the mixture density */
	    for (kk = 0; kk < n_top; kk++) {
		
		if (n_top == n_density)
		    k = kk;
		else
		    k = den_idx_row[kk];	/* i.e. density k is one of the n_top densities */
		
		obs_cnt = denacc_row[k];	/* observation count for density (k) at this time frame
						   given the model */
		
		/* don't bother adding a bunch of
		   essentially zero values */
		if (obs_cnt <= MIN_POS_FLOAT32)
		    continue;

#ifdef ACCUM_VERBOSE
		printf("denacc[%u][%u][%3u] == %.3e\n", i, j, k, obs_cnt);
#endif
		if (pdumpfh)
			fprintf(pdumpfh, "%u %u %u %g\n", lcl2gbl[i], j, k, obs_cnt);

		m = macc[i][j][k];	/* the vector accumulator for mean (i,j,k) */

		if (pass2var) {
		    g_i = lcl2gbl[i];
		    pm = mean[g_i][j][k];	/* the mean (i, j, k) */
		}

		if (var_reest) {
		    if (var_is_full)
			fv = fullvacc[i][j][k];
		    else
			v = vacc[i][j][k];	/* the vector accumulator for variance (i,j,k) */
		}

		if (var_reest && var_is_full) {
		    if (!pass2var)
			outerproduct(cov, feat, feat, g->veclen[j]);
		    else {
			for (l = 0; l < g->veclen[j]; ++l)
			    dvec[l] = feat[l] - pm[l];
			outerproduct(cov, dvec, dvec, g->veclen[j]);
		    }
		    scalarmultiply(cov, obs_cnt, g->veclen[j]);
		    matrixadd(fv, cov, g->veclen[j]);
		}

    	        if (mean_reest) {
		    for (l = 0; l < g->veclen[j]; l++) {
			m[l] += obs_cnt * feat[l];
		    }
		}
		
		if (var_reest && !var_is_full) {
		    if (!pass2var) {
			for (l = 0; l < g->veclen[j]; l++) {
			    /* Always reest vars on untransformed features for now */
			    /* This does NOT work with -2passvar no (for pretty obvious reasons) */
			    v[l] += obs_cnt * feat[l] * feat[l];
			}
		    } else {
			for (l = 0; l < g->veclen[j]; l++) {
			    diff = feat[l] - pm[l];    
			    diff *= diff;
			    v[l] += obs_cnt * diff;
			}
		    }
		}

		/* accumulate observation count for all densities */
		dnom[i][j][k] += obs_cnt;
	    }
	    if (var_is_full) {
		ckd_free_2d((void **)cov);
		cov = NULL;
		ckd_free(dvec);
		dvec = NULL;
	    }
	}
    }

    if (pdumpfh)
	    fputs("\n", pdumpfh);

    return S3_SUCCESS;
}